

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::TriangleMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  long lVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t *psVar21;
  undefined4 uVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 extraout_var [56];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar35;
  undefined1 auVar34 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [64];
  float fVar42;
  float fVar44;
  float fVar45;
  undefined1 auVar43 [16];
  float fVar46;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_198 [16];
  ulong local_140;
  anon_class_16_2_4e716a3c local_138;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar36._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar36._8_56_ = extraout_var;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = time_range->lower;
  auVar29._4_4_ = time_range->upper;
  auVar26 = auVar36._0_16_;
  auVar27 = vcmpps_avx(auVar26,auVar29,1);
  auVar6 = vblendps_avx(auVar29,auVar26,2);
  auVar26 = vinsertps_avx(auVar26,auVar29,0x50);
  auVar6 = vblendvps_avx(auVar26,auVar6,auVar27);
  auVar27 = vmovshdup_avx(auVar6);
  fVar42 = auVar27._0_4_;
  if (auVar6._0_4_ <= fVar42) {
    uVar18 = r->_begin;
    sVar15 = 0;
    auVar47 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar48 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar27._8_4_ = 0xff800000;
    auVar27._0_8_ = 0xff800000ff800000;
    auVar27._12_4_ = 0xff800000;
    auVar38 = ZEXT1664(auVar27);
    auVar49 = ZEXT1664(auVar27);
    local_198._8_4_ = 0x7f800000;
    local_198._0_8_ = 0x7f8000007f800000;
    local_198._12_4_ = 0x7f800000;
    auVar36 = ZEXT1664(local_198);
    while( true ) {
      if (r->_end <= uVar18) break;
      BVar2 = (this->super_TriangleMesh).super_Geometry.time_range;
      auVar26._8_8_ = 0;
      auVar26._0_4_ = BVar2.lower;
      auVar26._4_4_ = BVar2.upper;
      auVar27 = vmovshdup_avx(auVar26);
      fVar24 = BVar2.lower;
      fVar32 = auVar6._0_4_ - fVar24;
      fVar35 = auVar27._0_4_ - fVar24;
      lVar3 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
      lVar19 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar18;
      pBVar4 = (this->super_TriangleMesh).vertices.items;
      uVar20 = (pBVar4->super_RawBufferView).num;
      if (((*(uint *)(lVar3 + lVar19) < uVar20) &&
          (uVar13 = (ulong)*(uint *)(lVar3 + 4 + lVar19), uVar13 < uVar20)) &&
         (uVar14 = (ulong)*(uint *)(lVar3 + 8 + lVar19), uVar14 < uVar20)) {
        fVar1 = (this->super_TriangleMesh).super_Geometry.fnumTimeSegments;
        auVar26 = ZEXT416((uint)(fVar1 * (fVar32 / fVar35) * 1.0000002));
        auVar26 = vroundss_avx(auVar26,auVar26,9);
        auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,auVar26);
        auVar29 = ZEXT416((uint)(fVar1 * ((fVar42 - fVar24) / fVar35) * 0.99999976));
        auVar29 = vroundss_avx(auVar29,auVar29,10);
        auVar29 = vminss_avx(auVar29,ZEXT416((uint)fVar1));
        psVar21 = &pBVar4[(int)auVar26._0_4_].super_RawBufferView.stride;
        uVar20 = (long)(int)auVar26._0_4_ - 1;
LAB_00b98e12:
        uVar20 = uVar20 + 1;
        if ((ulong)(long)(int)auVar29._0_4_ < uVar20) {
          fVar25 = auVar27._0_4_ - fVar24;
          fVar32 = fVar32 / fVar25;
          fVar25 = (fVar42 - fVar24) / fVar25;
          fVar35 = fVar1 * fVar32;
          fVar24 = fVar1 * fVar25;
          auVar29 = vroundss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),9);
          auVar30 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar27 = vmaxss_avx(auVar29,ZEXT816(0));
          auVar26 = vminss_avx(auVar30,ZEXT416((uint)fVar1));
          iVar17 = (int)auVar27._0_4_;
          fVar33 = auVar26._0_4_;
          iVar12 = (int)auVar29._0_4_;
          iVar23 = -1;
          if (-1 < iVar12) {
            iVar23 = iVar12;
          }
          local_138.primID = &local_140;
          iVar9 = (int)fVar1 + 1;
          if ((int)auVar30._0_4_ < (int)fVar1 + 1) {
            iVar9 = (int)auVar30._0_4_;
          }
          local_140 = uVar18;
          local_138.this = &this->super_TriangleMesh;
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower0,&local_138,(long)iVar17);
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper1,&local_138,(long)(int)fVar33);
          fVar35 = fVar35 - auVar27._0_4_;
          if (iVar9 - iVar23 == 1) {
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar35),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar37._0_4_ =
                 auVar26._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar27._0_4_ * blower0.lower.field_0.m128[0];
            auVar37._4_4_ =
                 auVar26._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar27._4_4_ * blower0.lower.field_0.m128[1];
            auVar37._8_4_ =
                 auVar26._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar27._8_4_ * blower0.lower.field_0.m128[2];
            auVar37._12_4_ =
                 auVar26._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar27._12_4_ * blower0.lower.field_0.m128[3];
            auVar43._0_4_ =
                 auVar26._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar27._0_4_ * blower0.upper.field_0.m128[0];
            auVar43._4_4_ =
                 auVar26._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar27._4_4_ * blower0.upper.field_0.m128[1];
            auVar43._8_4_ =
                 auVar26._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar27._8_4_ * blower0.upper.field_0.m128[2];
            auVar43._12_4_ =
                 auVar26._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar27._12_4_ * blower0.upper.field_0.m128[3];
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar24)),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar30._0_4_ =
                 auVar27._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar26._0_4_ * blower0.lower.field_0.m128[0];
            auVar30._4_4_ =
                 auVar27._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar26._4_4_ * blower0.lower.field_0.m128[1];
            auVar30._8_4_ =
                 auVar27._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar26._8_4_ * blower0.lower.field_0.m128[2];
            auVar30._12_4_ =
                 auVar27._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar26._12_4_ * blower0.lower.field_0.m128[3];
            auVar34._0_4_ =
                 auVar27._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar26._0_4_ * blower0.upper.field_0.m128[0];
            auVar34._4_4_ =
                 auVar27._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar26._4_4_ * blower0.upper.field_0.m128[1];
            auVar34._8_4_ =
                 auVar27._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar26._8_4_ * blower0.upper.field_0.m128[2];
            auVar34._12_4_ =
                 auVar27._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar26._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&blower1,&local_138,(long)(iVar17 + 1));
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bupper0,&local_138,(long)((int)fVar33 + -1));
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar35),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar37._0_4_ =
                 auVar26._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar27._0_4_ * blower0.lower.field_0.m128[0];
            auVar37._4_4_ =
                 auVar26._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar27._4_4_ * blower0.lower.field_0.m128[1];
            auVar37._8_4_ =
                 auVar26._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar27._8_4_ * blower0.lower.field_0.m128[2];
            auVar37._12_4_ =
                 auVar26._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar27._12_4_ * blower0.lower.field_0.m128[3];
            auVar43._0_4_ =
                 auVar26._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar27._0_4_ * blower0.upper.field_0.m128[0];
            auVar43._4_4_ =
                 auVar26._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar27._4_4_ * blower0.upper.field_0.m128[1];
            auVar43._8_4_ =
                 auVar26._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar27._8_4_ * blower0.upper.field_0.m128[2];
            auVar43._12_4_ =
                 auVar26._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar27._12_4_ * blower0.upper.field_0.m128[3];
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar24)),ZEXT816(0) << 0x40);
            auVar26 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar30._0_4_ =
                 auVar26._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar27._0_4_ * bupper1.lower.field_0.m128[0];
            auVar30._4_4_ =
                 auVar26._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar27._4_4_ * bupper1.lower.field_0.m128[1];
            auVar30._8_4_ =
                 auVar26._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar27._8_4_ * bupper1.lower.field_0.m128[2];
            auVar30._12_4_ =
                 auVar26._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar27._12_4_ * bupper1.lower.field_0.m128[3];
            auVar34._0_4_ =
                 auVar26._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar27._0_4_ * bupper1.upper.field_0.m128[0];
            auVar34._4_4_ =
                 auVar26._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar27._4_4_ * bupper1.upper.field_0.m128[1];
            auVar34._8_4_ =
                 auVar26._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar27._8_4_ * bupper1.upper.field_0.m128[2];
            auVar34._12_4_ =
                 auVar26._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar27._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar12 < 0) {
              iVar12 = -1;
            }
            sVar16 = (size_t)iVar12;
            while (sVar16 = sVar16 + 1, (long)sVar16 < (long)iVar9) {
              auVar28._0_4_ = ((float)(int)sVar16 / fVar1 - fVar32) / (fVar25 - fVar32);
              auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vshufps_avx(auVar28,auVar28,0);
              local_1d8 = auVar30._0_4_;
              fStack_1d4 = auVar30._4_4_;
              fStack_1d0 = auVar30._8_4_;
              fStack_1cc = auVar30._12_4_;
              auVar26 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
              fVar39 = auVar37._4_4_;
              fVar40 = auVar37._8_4_;
              fVar41 = auVar37._12_4_;
              fVar35 = auVar34._4_4_;
              fVar24 = auVar34._8_4_;
              fVar33 = auVar34._12_4_;
              fVar44 = auVar43._4_4_;
              fVar45 = auVar43._8_4_;
              fVar46 = auVar43._12_4_;
              TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                        (&bi,&local_138,sVar16);
              auVar11._4_4_ = auVar27._4_4_ * fStack_1d4 + fVar39 * auVar26._4_4_;
              auVar11._0_4_ = auVar27._0_4_ * local_1d8 + auVar37._0_4_ * auVar26._0_4_;
              auVar11._8_4_ = auVar27._8_4_ * fStack_1d0 + fVar40 * auVar26._8_4_;
              auVar11._12_4_ = auVar27._12_4_ * fStack_1cc + fVar41 * auVar26._12_4_;
              auVar29 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar11);
              auVar10._4_4_ = fVar35 * auVar27._4_4_ + fVar44 * auVar26._4_4_;
              auVar10._0_4_ = auVar34._0_4_ * auVar27._0_4_ + auVar43._0_4_ * auVar26._0_4_;
              auVar10._8_4_ = fVar24 * auVar27._8_4_ + fVar45 * auVar26._8_4_;
              auVar10._12_4_ = fVar33 * auVar27._12_4_ + fVar46 * auVar26._12_4_;
              auVar27 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
              auVar26 = vminps_avx(auVar29,ZEXT816(0) << 0x40);
              auVar27 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
              auVar37._0_4_ = auVar37._0_4_ + auVar26._0_4_;
              auVar37._4_4_ = fVar39 + auVar26._4_4_;
              auVar37._8_4_ = fVar40 + auVar26._8_4_;
              auVar37._12_4_ = fVar41 + auVar26._12_4_;
              auVar30._0_4_ = local_1d8 + auVar26._0_4_;
              auVar30._4_4_ = fStack_1d4 + auVar26._4_4_;
              auVar30._8_4_ = fStack_1d0 + auVar26._8_4_;
              auVar30._12_4_ = fStack_1cc + auVar26._12_4_;
              auVar43._0_4_ = auVar43._0_4_ + auVar27._0_4_;
              auVar43._4_4_ = fVar44 + auVar27._4_4_;
              auVar43._8_4_ = fVar45 + auVar27._8_4_;
              auVar43._12_4_ = fVar46 + auVar27._12_4_;
              auVar34._0_4_ = auVar34._0_4_ + auVar27._0_4_;
              auVar34._4_4_ = fVar35 + auVar27._4_4_;
              auVar34._8_4_ = fVar24 + auVar27._8_4_;
              auVar34._12_4_ = fVar33 + auVar27._12_4_;
            }
          }
          auVar27 = vmaxps_avx(auVar43,auVar34);
          auVar26 = vminps_avx(auVar37,auVar30);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar26,ZEXT416(geomID),0x30);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar27,ZEXT416((uint)uVar18),0x30);
          local_198 = vminps_avx(local_198,(undefined1  [16])aVar7);
          auVar27 = vmaxps_avx((undefined1  [16])auVar49._0_16_,(undefined1  [16])aVar8);
          auVar49 = ZEXT1664(auVar27);
          auVar31._0_4_ = aVar7.x + aVar8.x;
          auVar31._4_4_ = aVar7.y + aVar8.y;
          auVar31._8_4_ = aVar7.z + aVar8.z;
          auVar31._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
          auVar27 = vminps_avx((undefined1  [16])auVar36._0_16_,auVar31);
          auVar36 = ZEXT1664(auVar27);
          auVar27 = vmaxps_avx((undefined1  [16])auVar38._0_16_,auVar31);
          auVar38 = ZEXT1664(auVar27);
          sVar15 = sVar15 + 1;
          prims[k].lower.field_0.field_1 = aVar7;
          prims[k].upper.field_0.field_1 = aVar8;
          auVar47 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar48 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
        else {
          pcVar5 = ((RawBufferView *)(psVar21 + -2))->ptr_ofs;
          sVar16 = *psVar21;
          auVar34 = auVar47._0_16_;
          auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * *(uint *)(lVar3 + lVar19)),
                               auVar34,6);
          auVar37 = auVar48._0_16_;
          auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * *(uint *)(lVar3 + lVar19)),
                               auVar37,1);
          auVar26 = vandps_avx(auVar26,auVar30);
          uVar22 = vmovmskps_avx(auVar26);
          if ((~(byte)uVar22 & 7) == 0) {
            auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar13),auVar34,6);
            auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar13),auVar37,1);
            auVar26 = vandps_avx(auVar26,auVar30);
            uVar22 = vmovmskps_avx(auVar26);
            if ((~(byte)uVar22 & 7) == 0) goto code_r0x00b98e81;
          }
        }
      }
LAB_00b99140:
      uVar18 = uVar18 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar49._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar36._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar38._0_16_;
    __return_storage_ptr__->end = sVar15;
  }
  return __return_storage_ptr__;
code_r0x00b98e81:
  psVar21 = psVar21 + 7;
  auVar26 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar14),auVar34,6);
  auVar30 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar14),auVar37,1);
  auVar26 = vandps_avx(auVar26,auVar30);
  uVar22 = vmovmskps_avx(auVar26);
  if ((~(byte)uVar22 & 7) != 0) goto LAB_00b99140;
  goto LAB_00b98e12;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }